

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ImportWriteProtection.cpp
# Opt level: O0

bool axl::spy::restoreImportWriteProtection(ImportWriteProtectionBackup *backup)

{
  int iVar1;
  long *in_RDI;
  int result;
  int prot;
  uint local_14;
  bool local_1;
  
  if (*in_RDI == 0) {
    local_1 = true;
  }
  else {
    local_14 = (uint)((*(uint *)(in_RDI + 2) & 4) != 0);
    if ((*(uint *)(in_RDI + 2) & 2) != 0) {
      local_14 = local_14 | 2;
    }
    if ((*(uint *)(in_RDI + 2) & 1) != 0) {
      local_14 = local_14 | 4;
    }
    iVar1 = mprotect((void *)*in_RDI,in_RDI[1],local_14);
    local_1 = iVar1 != -1;
  }
  return local_1;
}

Assistant:

bool
restoreImportWriteProtection(const ImportWriteProtectionBackup* backup) {
	if (!backup->m_p) // nothing to restore
		return true;

	int prot = 0;

	if (backup->m_flags & PF_R)
		prot |= PROT_READ;

	if (backup->m_flags & PF_W)
		prot |= PROT_WRITE;

	if (backup->m_flags & PF_X)
		prot |= PROT_EXEC;

	int result = ::mprotect(backup->m_p, backup->m_size, prot);
	return result != -1;
}